

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_sub_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  int iVar1;
  undefined1 local_20 [8];
  mbedtls_mpi B;
  mbedtls_mpi_uint p [1];
  
  B._8_8_ = -b;
  if (0 < b) {
    B._8_8_ = b;
  }
  local_20 = (undefined1  [8])&B.s;
  B.p._0_2_ = (ushort)(b >> 0x3e) | 1;
  B.p._2_2_ = 1;
  iVar1 = add_sub_mpi(X,A,(mbedtls_mpi *)local_20,-1);
  return iVar1;
}

Assistant:

int mbedtls_mpi_sub_int(mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_sint b)
{
    mbedtls_mpi B;
    mbedtls_mpi_uint p[1];
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);

    p[0] = mpi_sint_abs(b);
    B.s = TO_SIGN(b);
    B.n = 1;
    B.p = p;

    return mbedtls_mpi_sub_mpi(X, A, &B);
}